

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttkern.c
# Opt level: O1

FT_Error tt_face_load_kern(TT_Face face,FT_Stream stream)

{
  bool bVar1;
  ushort uVar2;
  FT_Error FVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  FT_UInt FVar7;
  FT_UInt FVar8;
  long lVar9;
  FT_Byte *pFVar10;
  FT_UInt32 FVar11;
  FT_UInt FVar12;
  FT_Byte *pFVar13;
  uint uVar14;
  FT_Byte *pFVar15;
  FT_ULong table_size;
  uint local_3c;
  ulong local_38;
  
  FVar3 = (*face->goto_table)(face,0x6b65726e,stream,&local_38);
  if (((FVar3 == 0) && (FVar3 = 0x8e, 3 < local_38)) &&
     (FVar3 = FT_Stream_ExtractFrame(stream,local_38,&face->kern_table), FVar3 == 0)) {
    face->kern_table_size = local_38;
    pFVar13 = face->kern_table;
    uVar2 = *(ushort *)(pFVar13 + 2) << 8 | *(ushort *)(pFVar13 + 2) >> 8;
    FVar3 = 0;
    local_3c = 0;
    FVar11 = 0;
    FVar8 = 0;
    if (uVar2 != 0) {
      pFVar10 = pFVar13 + local_38;
      uVar14 = 0x20;
      if (uVar2 < 0x20) {
        uVar14 = (uint)uVar2;
      }
      pFVar13 = pFVar13 + 4;
      FVar12 = uVar14 + (uVar14 == 0);
      FVar7 = 0;
      FVar11 = 0;
      local_3c = 0;
      do {
        uVar14 = 1 << ((byte)FVar7 & 0x1f);
        if (pFVar10 < pFVar13 + 6) {
          bVar1 = false;
          pFVar15 = pFVar13;
        }
        else {
          uVar2 = *(ushort *)(pFVar13 + 2) << 8 | *(ushort *)(pFVar13 + 2) >> 8;
          if (uVar2 < 0xf) {
            bVar1 = false;
            pFVar15 = pFVar13 + 6;
          }
          else {
            pFVar15 = pFVar13 + uVar2;
            if (pFVar10 < pFVar13 + uVar2) {
              pFVar15 = pFVar10;
            }
            bVar1 = true;
            if (((pFVar13[4] == '\0') && ((pFVar13[5] & 3) == 1)) && (pFVar13 + 0xe <= pFVar15)) {
              uVar2 = *(ushort *)(pFVar13 + 6) << 8 | *(ushort *)(pFVar13 + 6) >> 8;
              lVar9 = (long)pFVar15 - (long)(pFVar13 + 0xe);
              uVar4 = (uint)(lVar9 / 6);
              if ((long)(ulong)(((uint)uVar2 + (uint)uVar2) * 3) <= lVar9) {
                uVar4 = (uint)uVar2;
              }
              FVar11 = FVar11 | uVar14;
              if (uVar4 != 0) {
                if (uVar4 - 1 != 0) {
                  uVar5 = *(uint *)(pFVar13 + 0xe);
                  lVar9 = 0;
                  uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                          uVar5 << 0x18;
                  do {
                    uVar6 = *(uint *)(pFVar13 + lVar9 + 0x14);
                    uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                            uVar6 << 0x18;
                    if (uVar6 < uVar5) goto LAB_00248f38;
                    lVar9 = lVar9 + 6;
                    uVar5 = uVar6;
                  } while ((ulong)(uVar4 - 1) * 6 != lVar9);
                }
                local_3c = local_3c | uVar14;
              }
            }
          }
        }
LAB_00248f38:
        pFVar13 = pFVar15;
        FVar8 = FVar7;
      } while ((bVar1) && (FVar7 = FVar7 + 1, FVar8 = FVar12, FVar7 != FVar12));
    }
    face->num_kern_tables = FVar8;
    face->kern_avail_bits = FVar11;
    face->kern_order_bits = local_3c;
  }
  return FVar3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_kern( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error   error;
    FT_ULong   table_size;
    FT_Byte*   p;
    FT_Byte*   p_limit;
    FT_UInt    nn, num_tables;
    FT_UInt32  avail = 0, ordered = 0;


    /* the kern table is optional; exit silently if it is missing */
    error = face->goto_table( face, TTAG_kern, stream, &table_size );
    if ( error )
      goto Exit;

    if ( table_size < 4 )  /* the case of a malformed table */
    {
      FT_ERROR(( "tt_face_load_kern:"
                 " kerning table is too small - ignored\n" ));
      error = FT_THROW( Table_Missing );
      goto Exit;
    }

    if ( FT_FRAME_EXTRACT( table_size, face->kern_table ) )
    {
      FT_ERROR(( "tt_face_load_kern:"
                 " could not extract kerning table\n" ));
      goto Exit;
    }

    face->kern_table_size = table_size;

    p       = face->kern_table;
    p_limit = p + table_size;

    p         += 2; /* skip version */
    num_tables = FT_NEXT_USHORT( p );

    if ( num_tables > 32 ) /* we only support up to 32 sub-tables */
      num_tables = 32;

    for ( nn = 0; nn < num_tables; nn++ )
    {
      FT_UInt    num_pairs, length, coverage, format;
      FT_Byte*   p_next;
      FT_UInt32  mask = (FT_UInt32)1UL << nn;


      if ( p + 6 > p_limit )
        break;

      p_next = p;

      p       += 2; /* skip version */
      length   = FT_NEXT_USHORT( p );
      coverage = FT_NEXT_USHORT( p );

      if ( length <= 6 + 8 )
        break;

      p_next += length;

      if ( p_next > p_limit )  /* handle broken table */
        p_next = p_limit;

      format = coverage >> 8;

      /* we currently only support format 0 kerning tables */
      if ( format != 0 )
        goto NextTable;

      /* only use horizontal kerning tables */
      if ( ( coverage & 3U ) != 0x0001 ||
           p + 8 > p_next              )
        goto NextTable;

      num_pairs = FT_NEXT_USHORT( p );
      p        += 6;

      if ( ( p_next - p ) < 6 * (int)num_pairs ) /* handle broken count */
        num_pairs = (FT_UInt)( ( p_next - p ) / 6 );

      avail |= mask;

      /*
       * Now check whether the pairs in this table are ordered.
       * We then can use binary search.
       */
      if ( num_pairs > 0 )
      {
        FT_ULong  count;
        FT_ULong  old_pair;


        old_pair = FT_NEXT_ULONG( p );
        p       += 2;

        for ( count = num_pairs - 1; count > 0; count-- )
        {
          FT_UInt32  cur_pair;


          cur_pair = FT_NEXT_ULONG( p );
          if ( cur_pair < old_pair )
            break;

          p += 2;
          old_pair = cur_pair;
        }

        if ( count == 0 )
          ordered |= mask;
      }

    NextTable:
      p = p_next;
    }

    face->num_kern_tables = nn;
    face->kern_avail_bits = avail;
    face->kern_order_bits = ordered;

  Exit:
    return error;
  }